

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::IsValidResult<double>(double val)

{
  uint uVar1;
  int classified;
  double val_local;
  
  uVar1 = std::fpclassify(val);
  if ((uVar1 < 2) || (uVar1 == 3)) {
    val_local._7_1_ = false;
  }
  else {
    val_local._7_1_ = true;
  }
  return val_local._7_1_;
}

Assistant:

bool IsValidResult(T val) {
  int classified = std::fpclassify(val);
  switch (classified) {
    case FP_NAN:
    case FP_INFINITE:
    case FP_SUBNORMAL:
      return false;
    default:
      return true;
  }
}